

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_node_uremove(Curl_llist_node *e,void *user)

{
  Curl_llist *pCVar1;
  Curl_llist_dtor UNRECOVERED_JUMPTABLE;
  void *pvVar2;
  
  if ((e != (Curl_llist_node *)0x0) && (pCVar1 = e->_list, pCVar1 != (Curl_llist *)0x0)) {
    pvVar2 = Curl_node_take_elem(e);
    UNRECOVERED_JUMPTABLE = pCVar1->_dtor;
    if (UNRECOVERED_JUMPTABLE != (Curl_llist_dtor)0x0) {
      (*UNRECOVERED_JUMPTABLE)(user,pvVar2);
      return;
    }
  }
  return;
}

Assistant:

void
Curl_node_uremove(struct Curl_llist_node *e, void *user)
{
  struct Curl_llist *list;
  void *ptr;
  if(!e)
    return;

  list = e->_list;
  DEBUGASSERT(list);
  if(list) {
    ptr = Curl_node_take_elem(e);
    if(list->_dtor)
      list->_dtor(user, ptr);
  }
}